

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O3

DASHEventMessageBoxv1 *
event_track::generate_random_event
          (DASHEventMessageBoxv1 *__return_storage_ptr__,bool set_duration_to_zero,uint32_t max_p,
          uint32_t max_d)

{
  uint uVar1;
  uint32_t uVar2;
  ulong uVar3;
  result_type rVar4;
  long lVar5;
  uniform_int_distribution<unsigned_long> distD;
  uniform_int_distribution<unsigned_long> distP;
  mt19937 rng;
  random_device dev;
  param_type local_2758;
  uniform_int_distribution<unsigned_long> local_2748;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2738;
  random_device local_13b0;
  
  std::random_device::random_device(&local_13b0);
  uVar1 = std::random_device::_M_getval();
  local_2738._M_x[0] = (unsigned_long)uVar1;
  lVar5 = 1;
  uVar3 = local_2738._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar5);
    local_2738._M_x[lVar5] = uVar3;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  local_2738._M_p = 0x270;
  local_2748._M_param._M_b = (unsigned_long)max_p;
  local_2748._M_param._M_a = 1;
  local_2758._M_b = (unsigned_long)max_d;
  local_2758._M_a = 1;
  (__return_storage_ptr__->super_full_box).super_box.size_ = 0;
  uVar2 = 0;
  (__return_storage_ptr__->super_full_box).super_box.large_size_ = 0;
  (__return_storage_ptr__->super_full_box).super_box.box_type_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_full_box).super_box.box_type_.field_2;
  (__return_storage_ptr__->super_full_box).super_box.box_type_._M_string_length = 0;
  (__return_storage_ptr__->super_full_box).super_box.box_type_.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(__return_storage_ptr__->super_full_box).super_box.field_0x64 = 0;
  (__return_storage_ptr__->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 3) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 3) = 0;
  (__return_storage_ptr__->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_001272b0;
  (__return_storage_ptr__->scheme_id_uri_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->scheme_id_uri_).field_2;
  (__return_storage_ptr__->scheme_id_uri_)._M_string_length = 0;
  (__return_storage_ptr__->scheme_id_uri_).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->value_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value_).field_2;
  (__return_storage_ptr__->value_)._M_string_length = 0;
  (__return_storage_ptr__->value_).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (!set_duration_to_zero) {
    rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)&local_2758,&local_2738,
                       &local_2758);
    uVar2 = (uint32_t)rVar4;
  }
  __return_storage_ptr__->event_duration_ = uVar2;
  rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                    (&local_2748,&local_2738,&local_2748._M_param);
  __return_storage_ptr__->presentation_time_ = rVar4;
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->scheme_id_uri_,0,
             (char *)(__return_storage_ptr__->scheme_id_uri_)._M_string_length,0x11d628);
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->value_,0,
             (char *)(__return_storage_ptr__->value_)._M_string_length,0x11dbb8);
  *(undefined4 *)&(__return_storage_ptr__->super_full_box).field_0x6c = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&__return_storage_ptr__->message_data_,2);
  *(__return_storage_ptr__->message_data_).
   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data
   ._M_start = (uchar)__return_storage_ptr__->presentation_time_;
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = (uchar)__return_storage_ptr__->event_duration_;
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

event_track::DASHEventMessageBoxv1 event_track::generate_random_event(bool set_duration_to_zero, uint32_t max_p , uint32_t max_d )
{
	std::default_random_engine generator;
	std::random_device dev;
	std::mt19937 rng(dev());

	std::uniform_int_distribution<std::mt19937::result_type> distP(1, max_p);
	std::uniform_int_distribution<std::mt19937::result_type> distD(1, max_d);

	event_track::DASHEventMessageBoxv1 e;

	if (!set_duration_to_zero)
		e.event_duration_ = distD(rng);
	else
		e.event_duration_ = 0;

	e.presentation_time_ = distP(rng);
	e.scheme_id_uri_ = "random-1-100";
	e.value_ = "";
	e.timescale_ = 1;
	e.message_data_.resize(2);
	e.message_data_[0] = (uint8_t)e.presentation_time_;
	e.message_data_[1] = (uint8_t)e.event_duration_;

	return e;
}